

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

Schema __thiscall capnp::SchemaLoader::loadOnce(SchemaLoader *this,Reader *reader)

{
  RawSchema *pRVar1;
  undefined8 uVar2;
  Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> locked;
  Table<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
  local_30;
  undefined7 uStack_2f;
  undefined8 local_20;
  
  local_30 = (Table<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
              )0x0;
  uVar2 = 0;
  kj::_::Mutex::lock((Mutex *)this,0);
  if (0x3f < (reader->_reader).dataSize) {
    uVar2 = *(reader->_reader).data;
  }
  local_20 = uVar2;
  kj::
  Table<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
  ::find<0ul,unsigned_long&>(&local_30,(unsigned_long *)&((this->impl).value.ptr)->schemas);
  if (CONCAT71(uStack_2f,local_30) == 0) {
    pRVar1 = (RawSchema *)0x0;
  }
  else {
    pRVar1 = *(RawSchema **)(CONCAT71(uStack_2f,local_30) + 8);
  }
  if ((pRVar1 == (RawSchema *)0x0) || (pRVar1->lazyInitializer != (Initializer *)0x0)) {
    pRVar1 = Impl::load((this->impl).value.ptr,reader,false);
  }
  if (this != (SchemaLoader *)0x0) {
    kj::_::Mutex::unlock((Mutex *)this,EXCLUSIVE,(Waiter *)0x0);
  }
  return (Schema)&pRVar1->defaultBrand;
}

Assistant:

Schema SchemaLoader::loadOnce(const schema::Node::Reader& reader) const {
  auto locked = impl.lockExclusive();
  auto getResult = locked->get()->tryGet(reader.getId());
  if (getResult.schema == nullptr || getResult.schema->lazyInitializer != nullptr) {
    // Doesn't exist yet, or the existing schema is a placeholder and therefore has not yet been
    // seen publicly.  Go ahead and load the incoming reader.
    return Schema(&locked->get()->load(reader, false)->defaultBrand);
  } else {
    return Schema(&getResult.schema->defaultBrand);
  }
}